

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenSolver.h
# Opt level: O3

void __thiscall
Eigen::EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::doComputeEigenvectors
          (EigenSolver<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this)

{
  MatrixType *pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  bool bVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  undefined8 extraout_XMM0_Qa;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false> *pBVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>_>
  tmp;
  double local_f8;
  double local_f0;
  double local_e8;
  SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>_>
  local_e0;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,_2,_1>_>
  local_d0;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false> local_b8;
  double *local_78;
  MatrixType *local_68;
  undefined8 local_60;
  undefined8 local_58;
  
  pMVar1 = &this->m_matT;
  dVar16 = 0.0;
  lVar7 = 0;
  bVar6 = true;
  do {
    bVar8 = bVar6;
    dVar16 = dVar16 + ABS((this->m_matT).
                          super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                          m_data.array[lVar7 + 2]) +
                      ABS((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                          m_storage.m_data.array[lVar7]);
    lVar7 = 1;
    bVar6 = false;
  } while (bVar8);
  if ((dVar16 != 0.0) || (NAN(dVar16))) {
    dVar14 = *(double *)
              (this->m_eivalues).
              super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.m_storage.
              m_data.array[1]._M_value;
    local_f8 = *(double *)
                ((this->m_eivalues).
                 super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                 m_storage.m_data.array[1]._M_value + 8);
    lVar7 = 1;
    local_f0 = local_f8;
    if ((local_f8 == 0.0) && (!NAN(local_f8))) {
      dVar16 = dVar16 * 2.220446049250313e-16;
      bVar8 = true;
      bVar6 = false;
      local_e8 = dVar16;
      do {
        pdVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                 m_data.array + lVar7 * 2;
        pdVar5[lVar7] = 1.0;
        if (bVar6) goto LAB_00126033;
        if (!bVar8) {
          __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Redux.h"
                        ,0xaf,
                        "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double, double>, const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<double>, Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double, double>, const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 1, 2>, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 2, 2>, 2, 1, true>, -1, 1>>, Traversal = 0, Unrolling = 0]"
                       );
        }
        dVar2 = *(double *)
                 ((this->m_eivalues).
                  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                  m_storage.m_data.array[0]._M_value + 8);
        if (0.0 <= dVar2) {
          dVar15 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
                   m_data.array[0] - dVar14;
          dVar13 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                   m_storage.m_data.array[2] * pdVar5[1];
          if ((dVar2 != 0.0) || (NAN(dVar2))) {
            dVar3 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array[2];
            dVar4 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array[1];
            dVar14 = *(double *)
                      (this->m_eivalues).
                      super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                      m_storage.m_data.array[0]._M_value - dVar14;
            dVar14 = (dVar3 * 0.0 + dVar13 * -0.0) / (dVar14 * dVar14 + dVar2 * dVar2);
            *pdVar5 = dVar14;
            if (dVar3 == 0.0) {
              pdVar5[1] = (dVar4 * dVar14) / -0.0;
            }
            else {
              pdVar5[1] = (-dVar15 * dVar14 - dVar13) / dVar3;
            }
          }
          else {
            if ((dVar15 != 0.0) || (dVar14 = dVar16, NAN(dVar15))) {
              dVar14 = dVar15;
            }
            dVar14 = -dVar13 / dVar14;
            *pdVar5 = dVar14;
          }
          dVar14 = ABS(dVar14);
          if (1.0 < dVar14 * 2.220446049250313e-16 * dVar14) {
            local_b8.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
            .m_rows.m_value = 2;
            local_b8.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
            .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
            m_outerStride = 2;
            local_b8.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
            .m_outerStride = 2;
            local_e0.m_matrix = &local_b8;
            local_d0.m_rows.m_value = 2;
            local_e0.m_functor = (scalar_quotient_op<double,_double> *)&local_d0;
            local_d0.m_functor.m_other = dVar14;
            local_b8.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
            .m_data = pdVar5;
            local_b8.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
            .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.m_data
                 = pdVar5;
            local_b8.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
            .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr =
                 pMVar1;
            SelfCwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_2,_1>_>_>
            ::operator=(&local_e0,&local_d0);
            dVar16 = local_e8;
          }
        }
        dVar14 = *(double *)
                  (this->m_eivalues).
                  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                  m_storage.m_data.array[0]._M_value;
        local_f8 = *(double *)
                    ((this->m_eivalues).
                     super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_2,_1,_0,_2,_1>_>.
                     m_storage.m_data.array[0]._M_value + 8);
        bVar6 = true;
        lVar7 = 0;
        bVar8 = false;
      } while ((local_f8 == 0.0) && (!NAN(local_f8)));
    }
    if (((local_f0 == 0.0) && (!NAN(local_f0))) || (0.0 <= local_f8)) {
      __assert_fail("0 && \"Internal bug in EigenSolver\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Eigenvalues/EigenSolver.h"
                    ,0x251,
                    "void Eigen::EigenSolver<Eigen::Matrix<double, 2, 2>>::doComputeEigenvectors() [_MatrixType = Eigen::Matrix<double, 2, 2>]"
                   );
    }
    iVar10 = (int)lVar7;
    uVar9 = (ulong)(uint)(iVar10 << 4);
    pdVar5 = (double *)
             ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage
                    .m_data.array + lVar7 * 8 + (uVar9 - 0x10));
    dVar16 = *pdVar5;
    dVar2 = pdVar5[1];
    if (ABS(dVar16) <= ABS(dVar2)) {
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
      .m_data = (PointerType)0x0;
      local_d0.m_rows.m_value = (ulong)dVar2 ^ (ulong)DAT_0012d420;
      pBVar12 = (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
                 *)(*(double *)
                     ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).
                            m_storage.m_data.array + lVar7 * 8 + (uVar9 - 0x18)) - dVar14);
      local_e0.m_matrix = pBVar12;
      cdiv<double>((double *)&local_b8,(double *)&local_d0,(double *)&local_e0,&local_f8);
      *(undefined8 *)
       ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array + lVar7 * 8 + (uVar9 - 0x18)) = extraout_XMM0_Qa;
    }
    else {
      *(double *)
       ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.
              m_data.array + (ulong)(uint)(iVar10 * 8) + (uVar9 - 0x18)) = local_f8 / dVar16;
      pBVar12 = (Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
                 *)(-(*(double *)
                       ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>)
                              .m_storage.m_data.array + (uint)(iVar10 * 8) + uVar9) - dVar14) /
                   dVar16);
    }
    uVar11 = (ulong)(uint)(iVar10 << 3);
    *(Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false> **)
     ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.
            array + uVar11 + (uVar9 - 8)) = pBVar12;
    *(undefined8 *)
     ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.
            array + uVar11 + (uVar9 - 0x10)) = 0;
    *(undefined8 *)
     ((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.
            array + uVar11 + uVar9) = 0x3ff0000000000000;
LAB_00126033:
    lVar7 = 1;
    bVar6 = true;
    do {
      bVar8 = bVar6;
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
      ._16_8_ = lVar7 + 1;
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr =
           (Nested)((pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage
                    .m_data.array + lVar7 * 2);
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>._8_8_ = 2;
      local_60 = 2;
      local_58 = 2;
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
      .m_data = (PointerType)this;
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_0>.m_data =
           (PointerType)this;
      local_b8.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
      .m_xpr.super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_outerStride =
           local_b8.
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_0>
           ._16_8_;
      local_78 = (double *)
                 local_b8.
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false,_true>
                 .m_xpr.
                 super_BlockImpl<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_Eigen::Dense>.
                 super_BlockImpl_dense<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true,_true>.m_xpr
      ;
      local_68 = pMVar1;
      PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>>::
      lazyAssign<Eigen::CoeffBasedProduct<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,_1,true>const,Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>const,6>>
                ((PlainObjectBase<Eigen::Matrix<double,2,1,0,2,1>> *)&this->m_tmp,
                 (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_6>_>
                  *)&local_b8);
      dVar16 = (this->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
               m_data.array[1];
      pdVar5 = (this->m_eivec).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
               m_storage.m_data.array + lVar7 * 2;
      *pdVar5 = (this->m_tmp).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage
                .m_data.array[0];
      pdVar5[1] = dVar16;
      lVar7 = 0;
      bVar6 = false;
    } while (bVar8);
  }
  return;
}

Assistant:

void EigenSolver<MatrixType>::doComputeEigenvectors()
{
  using std::abs;
  const Index size = m_eivec.cols();
  const Scalar eps = NumTraits<Scalar>::epsilon();

  // inefficient! this is already computed in RealSchur
  Scalar norm(0);
  for (Index j = 0; j < size; ++j)
  {
    norm += m_matT.row(j).segment((std::max)(j-1,Index(0)), size-(std::max)(j-1,Index(0))).cwiseAbs().sum();
  }
  
  // Backsubstitute to find vectors of upper triangular form
  if (norm == 0.0)
  {
    return;
  }

  for (Index n = size-1; n >= 0; n--)
  {
    Scalar p = m_eivalues.coeff(n).real();
    Scalar q = m_eivalues.coeff(n).imag();

    // Scalar vector
    if (q == Scalar(0))
    {
      Scalar lastr(0), lastw(0);
      Index l = n;

      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-1; i >= 0; i--)
      {
        Scalar w = m_matT.coeff(i,i) - p;
        Scalar r = m_matT.row(i).segment(l,n-l+1).dot(m_matT.col(n).segment(l, n-l+1));

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastr = r;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == 0.0)
          {
            if (w != 0.0)
              m_matT.coeffRef(i,n) = -r / w;
            else
              m_matT.coeffRef(i,n) = -r / (eps * norm);
          }
          else // Solve real equations
          {
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar denom = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag();
            Scalar t = (x * lastr - lastw * r) / denom;
            m_matT.coeffRef(i,n) = t;
            if (abs(x) > abs(lastw))
              m_matT.coeffRef(i+1,n) = (-r - w * t) / x;
            else
              m_matT.coeffRef(i+1,n) = (-lastr - y * t) / lastw;
          }

          // Overflow control
          Scalar t = abs(m_matT.coeff(i,n));
          if ((eps * t) * t > Scalar(1))
            m_matT.col(n).tail(size-i) /= t;
        }
      }
    }
    else if (q < Scalar(0) && n > 0) // Complex vector
    {
      Scalar lastra(0), lastsa(0), lastw(0);
      Index l = n-1;

      // Last vector component imaginary so matrix is triangular
      if (abs(m_matT.coeff(n,n-1)) > abs(m_matT.coeff(n-1,n)))
      {
        m_matT.coeffRef(n-1,n-1) = q / m_matT.coeff(n,n-1);
        m_matT.coeffRef(n-1,n) = -(m_matT.coeff(n,n) - p) / m_matT.coeff(n,n-1);
      }
      else
      {
        std::complex<Scalar> cc = cdiv<Scalar>(0.0,-m_matT.coeff(n-1,n),m_matT.coeff(n-1,n-1)-p,q);
        m_matT.coeffRef(n-1,n-1) = numext::real(cc);
        m_matT.coeffRef(n-1,n) = numext::imag(cc);
      }
      m_matT.coeffRef(n,n-1) = 0.0;
      m_matT.coeffRef(n,n) = 1.0;
      for (Index i = n-2; i >= 0; i--)
      {
        Scalar ra = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n-1).segment(l, n-l+1));
        Scalar sa = m_matT.row(i).segment(l, n-l+1).dot(m_matT.col(n).segment(l, n-l+1));
        Scalar w = m_matT.coeff(i,i) - p;

        if (m_eivalues.coeff(i).imag() < 0.0)
        {
          lastw = w;
          lastra = ra;
          lastsa = sa;
        }
        else
        {
          l = i;
          if (m_eivalues.coeff(i).imag() == RealScalar(0))
          {
            std::complex<Scalar> cc = cdiv(-ra,-sa,w,q);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
          }
          else
          {
            // Solve complex equations
            Scalar x = m_matT.coeff(i,i+1);
            Scalar y = m_matT.coeff(i+1,i);
            Scalar vr = (m_eivalues.coeff(i).real() - p) * (m_eivalues.coeff(i).real() - p) + m_eivalues.coeff(i).imag() * m_eivalues.coeff(i).imag() - q * q;
            Scalar vi = (m_eivalues.coeff(i).real() - p) * Scalar(2) * q;
            if ((vr == 0.0) && (vi == 0.0))
              vr = eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(lastw));

            std::complex<Scalar> cc = cdiv(x*lastra-lastw*ra+q*sa,x*lastsa-lastw*sa-q*ra,vr,vi);
            m_matT.coeffRef(i,n-1) = numext::real(cc);
            m_matT.coeffRef(i,n) = numext::imag(cc);
            if (abs(x) > (abs(lastw) + abs(q)))
            {
              m_matT.coeffRef(i+1,n-1) = (-ra - w * m_matT.coeff(i,n-1) + q * m_matT.coeff(i,n)) / x;
              m_matT.coeffRef(i+1,n) = (-sa - w * m_matT.coeff(i,n) - q * m_matT.coeff(i,n-1)) / x;
            }
            else
            {
              cc = cdiv(-lastra-y*m_matT.coeff(i,n-1),-lastsa-y*m_matT.coeff(i,n),lastw,q);
              m_matT.coeffRef(i+1,n-1) = numext::real(cc);
              m_matT.coeffRef(i+1,n) = numext::imag(cc);
            }
          }

          // Overflow control
          using std::max;
          Scalar t = (max)(abs(m_matT.coeff(i,n-1)),abs(m_matT.coeff(i,n)));
          if ((eps * t) * t > Scalar(1))
            m_matT.block(i, n-1, size-i, 2) /= t;

        }
      }
      
      // We handled a pair of complex conjugate eigenvalues, so need to skip them both
      n--;
    }
    else
    {
      eigen_assert(0 && "Internal bug in EigenSolver"); // this should not happen
    }
  }

  // Back transformation to get eigenvectors of original matrix
  for (Index j = size-1; j >= 0; j--)
  {
    m_tmp.noalias() = m_eivec.leftCols(j+1) * m_matT.col(j).segment(0, j+1);
    m_eivec.col(j) = m_tmp;
  }
}